

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O1

wchar_t set_xattrs(archive_write_disk *a)

{
  uint uVar1;
  archive_entry *entry;
  wchar_t wVar2;
  int iVar3;
  archive_string *paVar4;
  char *pcVar5;
  uint *puVar6;
  bool bVar7;
  char *name;
  size_t size;
  void *value;
  char *local_70;
  undefined4 local_68;
  wchar_t local_64;
  archive_write_disk *local_60;
  archive_string local_58;
  size_t local_40;
  void *local_38;
  
  entry = a->entry;
  local_60 = a;
  wVar2 = archive_entry_xattr_reset(entry);
  local_58.s = (char *)0x0;
  local_58.length = 0;
  local_58.buffer_length = 0;
  if (wVar2 == L'\0') {
    wVar2 = L'\0';
    bVar7 = false;
  }
  else {
    local_68 = 0;
    local_64 = L'\0';
    do {
      archive_entry_xattr_next(entry,&local_70,&local_38,&local_40);
      pcVar5 = local_70;
      if (local_70 != (char *)0x0) {
        iVar3 = strncmp(local_70,"system.",7);
        if (iVar3 == 0) {
          iVar3 = strcmp(pcVar5 + 7,"posix_acl_access");
          if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5 + 7,"posix_acl_default"), iVar3 == 0))
          goto LAB_002667b0;
        }
        iVar3 = strncmp(pcVar5,"trusted.SGI_",0xc);
        if (iVar3 == 0) {
          iVar3 = strcmp(pcVar5 + 0xc,"ACL_DEFAULT");
          if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5 + 0xc,"ACL_FILE"), iVar3 == 0))
          goto LAB_002667b0;
        }
        iVar3 = strncmp(pcVar5,"xfsroot.",8);
        if (iVar3 == 0) {
          archive_strcat(&local_58,pcVar5);
          paVar4 = archive_strappend_char(&local_58,' ');
LAB_0026677f:
          local_68 = (undefined4)CONCAT62((int6)((ulong)paVar4 >> 0x10),1);
        }
        else {
          if (local_60->fd < L'\0') {
            pcVar5 = archive_entry_pathname(entry);
            iVar3 = lsetxattr(pcVar5,local_70,local_38,local_40,0);
          }
          else {
            iVar3 = fsetxattr(local_60->fd,pcVar5,local_38,local_40,0);
          }
          if (iVar3 == -1) {
            archive_strcat(&local_58,local_70);
            archive_strappend_char(&local_58,' ');
            puVar6 = (uint *)__errno_location();
            uVar1 = *puVar6;
            paVar4 = (archive_string *)(ulong)uVar1;
            local_64 = L'\xffffffec';
            if ((uVar1 != 0x26) && (uVar1 != 0x5f)) goto LAB_0026677f;
          }
        }
      }
LAB_002667b0:
      wVar2 = wVar2 + L'\xffffffff';
    } while (wVar2 != L'\0');
    bVar7 = (short)local_68 != 0;
    wVar2 = local_64;
  }
  if (wVar2 == L'\xffffffec') {
    if ((bool)(bVar7 & local_58.length != 0)) {
      local_58.s[local_58.length - 1] = '\0';
      local_58.length = local_58.length - 1;
      archive_set_error(&local_60->archive,-1,"Cannot restore extended attributes: %s",local_58.s);
    }
    else {
      archive_set_error(&local_60->archive,-1,
                        "Cannot restore extended attributes on this file system.");
    }
  }
  archive_string_free(&local_58);
  return wVar2;
}

Assistant:

static int
set_xattrs(struct archive_write_disk *a)
{
	struct archive_entry *entry = a->entry;
	struct archive_string errlist;
	int ret = ARCHIVE_OK;
	int i = archive_entry_xattr_reset(entry);
	short fail = 0;

	archive_string_init(&errlist);

	while (i--) {
		const char *name;
		const void *value;
		size_t size;
		int e;

		archive_entry_xattr_next(entry, &name, &value, &size);

		if (name == NULL)
			continue;
#if ARCHIVE_XATTR_LINUX
		/* Linux: quietly skip POSIX.1e ACL extended attributes */
		if (strncmp(name, "system.", 7) == 0 &&
		   (strcmp(name + 7, "posix_acl_access") == 0 ||
		    strcmp(name + 7, "posix_acl_default") == 0))
			continue;
		if (strncmp(name, "trusted.SGI_", 12) == 0 &&
		   (strcmp(name + 12, "ACL_DEFAULT") == 0 ||
		    strcmp(name + 12, "ACL_FILE") == 0))
			continue;

		/* Linux: xfsroot namespace is obsolete and unsupported */
		if (strncmp(name, "xfsroot.", 8) == 0) {
			fail = 1;
			archive_strcat(&errlist, name);
			archive_strappend_char(&errlist, ' ');
			continue;
		}
#endif

		if (a->fd >= 0) {
#if ARCHIVE_XATTR_LINUX
			e = fsetxattr(a->fd, name, value, size, 0);
#elif ARCHIVE_XATTR_DARWIN
			e = fsetxattr(a->fd, name, value, size, 0, 0);
#elif ARCHIVE_XATTR_AIX
			e = fsetea(a->fd, name, value, size, 0);
#endif
		} else {
#if ARCHIVE_XATTR_LINUX
			e = lsetxattr(archive_entry_pathname(entry),
			    name, value, size, 0);
#elif ARCHIVE_XATTR_DARWIN
			e = setxattr(archive_entry_pathname(entry),
			    name, value, size, 0, XATTR_NOFOLLOW);
#elif ARCHIVE_XATTR_AIX
			e = lsetea(archive_entry_pathname(entry),
			    name, value, size, 0);
#endif
		}
		if (e == -1) {
			ret = ARCHIVE_WARN;
			archive_strcat(&errlist, name);
			archive_strappend_char(&errlist, ' ');
			if (errno != ENOTSUP && errno != ENOSYS)
				fail = 1;
		}
	}

	if (ret == ARCHIVE_WARN) {
		if (fail && errlist.length > 0) {
			errlist.length--;
			errlist.s[errlist.length] = '\0';
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Cannot restore extended attributes: %s",
			    errlist.s);
		} else
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Cannot restore extended "
			    "attributes on this file system.");
	}

	archive_string_free(&errlist);
	return (ret);
}